

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O2

void saa1099m_reset(void *info)

{
  undefined8 *puVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 0x28) {
    *(undefined8 *)((long)info + lVar2 + 0x3e) = 0;
    *(undefined8 *)((long)info + lVar2 + 0x38) = 0;
    puVar1 = (undefined8 *)((long)info + lVar2 + 0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)((long)info + lVar2 + 0x58) = 0;
  }
  puVar1 = (undefined8 *)((long)info + 0x128);
  *(undefined1 *)((long)info + 0x21) = 0;
  for (lVar2 = -2; lVar2 != 0; lVar2 = lVar2 + 1) {
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)(puVar1 + 2) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x26) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x28) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x2a) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x2c) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x24) = 0;
    *(undefined1 *)((long)info + lVar2 + 0x2e) = 0;
    puVar1 = puVar1 + 3;
  }
  *(undefined2 *)((long)info + 0x2e) = 0;
  return;
}

Assistant:

static void saa1099m_reset(void *info)
{
	saa1099_state *saa = (saa1099_state *)info;
	struct saa1099_channel *saach;
	UINT8 CurChn;

	for (CurChn = 0; CurChn < 6; CurChn ++)
	{
		saach = &saa->channels[CurChn];
		saach->frequency = 0;
		saach->octave = 0;
		saach->amplitude[0] = 0;
		saach->amplitude[1] = 0;
		saach->envelope[0] = 0;
		saach->envelope[1] = 0;
		saach->freq_enable = 0;
		saach->noise_enable = 0;
		
		saach->counter = 0;
		saach->freq = 0;
		saach->level = 0;
	}
	for (CurChn = 0; CurChn < 2; CurChn ++)
	{
		saa->noise[CurChn].counter = 0;
		saa->noise[CurChn].freq = 0;
		saa->noise[CurChn].level = 0;
		
		saa->noise_params[1] = 0x00;
		saa->env_reverse_right[CurChn] = 0x00;
		saa->env_mode[CurChn] = 0x00;
		saa->env_bits[CurChn] = 0x00;
		saa->env_clock[CurChn] = 0x00;
		saa->env_enable[CurChn] = 0x00;
		saa->env_step[CurChn] = 0;
	}
	
	saa->all_ch_enable = 0x00;
	saa->sync_state = 0x00;
	
	return;
}